

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Load_Glyph(FT_Face face,FT_UInt glyph_index,FT_Int32 load_flags)

{
  short sVar1;
  FT_Int FVar2;
  FT_GlyphSlot slot;
  undefined8 *puVar3;
  void *pvVar4;
  FT_Memory pFVar5;
  FT_Driver pFVar6;
  FT_Module pFVar7;
  FT_Module_Class *pFVar8;
  FT_Size pFVar9;
  ulong uVar10;
  FT_Face_Internal pFVar11;
  FT_Library pFVar12;
  FT_Render_Mode render_mode;
  long lVar13;
  long lVar14;
  FT_Error FVar15;
  int iVar16;
  FT_Render_Mode FVar17;
  FT_Slot_Internal pFVar18;
  char *pcVar19;
  FT_Pos FVar20;
  uint uVar21;
  uint uVar22;
  FT_Glyph_Format FVar23;
  FT_Pos FVar24;
  FT_Vector *pFVar25;
  ulong uVar26;
  ulong uVar27;
  FT_ListNode pFVar28;
  ulong uVar29;
  FT_Renderer_conflict pFVar30;
  FT_Module module;
  bool bVar31;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (face->size == (FT_Size)0x0) {
    return 0x23;
  }
  slot = face->glyph;
  if (slot == (FT_GlyphSlot)0x0) {
    return 0x23;
  }
  ft_glyphslot_free_bitmap(slot);
  slot->glyph_index = 0;
  (slot->metrics).width = 0;
  (slot->metrics).height = 0;
  (slot->metrics).horiBearingX = 0;
  (slot->metrics).horiBearingY = 0;
  (slot->metrics).horiAdvance = 0;
  (slot->metrics).vertBearingX = 0;
  (slot->metrics).vertBearingY = 0;
  (slot->metrics).vertAdvance = 0;
  (slot->bitmap).rows = 0;
  (slot->bitmap).width = 0;
  (slot->bitmap).pitch = 0;
  (slot->bitmap).pixel_mode = '\0';
  slot->bitmap_left = 0;
  slot->bitmap_top = 0;
  (slot->outline).n_contours = 0;
  (slot->outline).n_points = 0;
  *(undefined4 *)&(slot->outline).field_0x4 = 0;
  (slot->outline).points = (FT_Vector *)0x0;
  (slot->outline).tags = (char *)0x0;
  (slot->outline).contours = (short *)0x0;
  (slot->outline).flags = 0;
  *(undefined4 *)&(slot->outline).field_0x24 = 0;
  slot->num_subglyphs = 0;
  slot->subglyphs = (FT_SubGlyph)0x0;
  slot->control_data = (void *)0x0;
  slot->control_len = 0;
  if ((slot->face->face_flags & 0x10000) == 0) {
    slot->other = (void *)0x0;
  }
  else {
    pFVar18 = slot->internal;
    uVar21 = pFVar18->flags;
    if ((uVar21 & 2) != 0) {
      puVar3 = (undefined8 *)slot->other;
      pvVar4 = (void *)*puVar3;
      if (pvVar4 != (void *)0x0) {
        pFVar5 = slot->face->memory;
        (*pFVar5->free)(pFVar5,pvVar4);
        pFVar18 = slot->internal;
        uVar21 = pFVar18->flags;
      }
      *puVar3 = 0;
      pFVar18->flags = uVar21 & 0xfffffffd;
    }
  }
  (slot->advance).x = 0;
  (slot->advance).y = 0;
  slot->linearHoriAdvance = 0;
  slot->linearVertAdvance = 0;
  slot->format = FT_GLYPH_FORMAT_NONE;
  slot->lsb_delta = 0;
  slot->rsb_delta = 0;
  pFVar6 = face->driver;
  pFVar7 = ((pFVar6->root).library)->auto_hinter;
  if (((face->size->metrics).x_ppem == 0) || ((face->size->metrics).y_ppem == 0)) {
    load_flags = load_flags | 1;
  }
  uVar21 = load_flags | 0x801;
  if (((uint)load_flags >> 10 & 1) == 0) {
    uVar21 = load_flags;
  }
  uVar22 = uVar21 & 0xfffffff1 | 10;
  if ((uVar21 & 1) == 0) {
    uVar22 = uVar21;
  }
  uVar21 = uVar22 & 0xfffffffb;
  if ((uVar22 >> 0x16 & 1) == 0) {
    uVar21 = uVar22;
  }
  if ((((pFVar7 == (FT_Module)0x0) || ((uVar21 & 0x8002) != 0)) ||
      (uVar22 = (uint)face->face_flags, (uVar22 & 0x2001) != 1)) ||
     (((uVar21 >> 0xb & 1) == 0 &&
      (((face->internal->transform_matrix).yx == 0) == ((face->internal->transform_matrix).xx == 0))
      ))) {
LAB_00210778:
    FVar15 = (*pFVar6->clazz->load_glyph)(slot,face->size,glyph_index,uVar21);
    if (FVar15 != 0) {
      return FVar15;
    }
    FVar15 = 0;
    if (slot->format == FT_GLYPH_FORMAT_OUTLINE) {
      FVar15 = FT_Outline_Check(&slot->outline);
      if (FVar15 != 0) {
        return FVar15;
      }
      FVar15 = 0;
      if ((uVar21 & 2) == 0) {
        ft_glyphslot_grid_fit_metrics(slot,(byte)(uVar21 >> 4) & 1);
      }
    }
  }
  else {
    if (((uVar21 & 0x20) == 0) &&
       (pFVar8 = (pFVar6->root).clazz, (pFVar8->module_flags & 0x400) != 0)) {
      pcVar19 = (char *)(*pFVar8->get_interface)(&pFVar6->root,"font-format");
      pcVar19 = strstr(pcVar19,"Type 1");
      if (pcVar19 == (char *)0x0) {
        bVar31 = false;
      }
      else {
        bVar31 = *(int *)&pFVar6[1].root.clazz == 1;
      }
      if (((uVar21 & 0xf0000) != 0x10000) ||
         ((*(byte *)((long)&((pFVar6->root).clazz)->module_flags + 1) >> 3 & 1) != 0 || bVar31)) {
        uVar22 = (uint)face->face_flags;
        if ((((face->face_flags & 8U) == 0) ||
            (((face[5].style_flags == 0 || (*(short *)((long)&face[1].extensions + 6) != 0)) ||
             (face[4].bbox.xMax != 0)))) ||
           (lVar13._0_2_ = face[4].units_per_EM, lVar13._2_2_ = face[4].ascender,
           lVar13._4_2_ = face[4].descender, lVar13._6_2_ = face[4].height, lVar13 != 0))
        goto LAB_00210778;
      }
      else {
        uVar22 = (uint)face->face_flags;
      }
    }
    if (((((uVar22 >> 0x10 & 1) == 0) ||
         (FVar15 = (*pFVar6->clazz->load_glyph)(slot,face->size,glyph_index,uVar21 | 0x800000),
         FVar15 != 0)) || (slot->format != FT_GLYPH_FORMAT_SVG)) &&
       ((((face->face_flags & 2) == 0 || ((uVar21 & 8) != 0)) ||
        ((FVar15 = (*pFVar6->clazz->load_glyph)(slot,face->size,glyph_index,uVar21 | 0x4000),
         FVar15 != 0 || (slot->format != FT_GLYPH_FORMAT_BITMAP)))))) {
      pFVar11 = face->internal;
      FVar2 = pFVar11->transform_flags;
      pFVar11->transform_flags = 0;
      FVar15 = (**(code **)((long)pFVar7->clazz->module_interface + 0x18))
                         (pFVar7,slot,face->size,glyph_index,uVar21);
      pFVar11->transform_flags = FVar2;
    }
    else {
      FVar15 = 0;
    }
  }
  if ((uVar21 & 0x10) == 0) {
    FVar24 = (slot->metrics).horiAdvance;
    FVar20 = 0;
  }
  else {
    FVar20 = (slot->metrics).vertAdvance;
    FVar24 = 0;
  }
  (slot->advance).x = FVar24;
  (slot->advance).y = FVar20;
  if (((uVar21 >> 0xd & 1) == 0) && ((face->face_flags & 1) != 0)) {
    pFVar9 = face->size;
    uVar10 = (pFVar9->metrics).x_scale;
    uVar26 = -uVar10;
    if (0 < (long)uVar10) {
      uVar26 = uVar10;
    }
    uVar27 = slot->linearHoriAdvance;
    uVar29 = -uVar27;
    if (0 < (long)uVar27) {
      uVar29 = uVar27;
    }
    uVar29 = uVar29 * uVar26 + 0x20 >> 6;
    uVar26 = -uVar29;
    if (-1 < (long)(uVar10 ^ uVar27)) {
      uVar26 = uVar29;
    }
    uVar10 = slot->linearVertAdvance;
    slot->linearHoriAdvance = uVar26;
    uVar26 = (pFVar9->metrics).y_scale;
    uVar27 = -uVar26;
    if (0 < (long)uVar26) {
      uVar27 = uVar26;
    }
    uVar29 = -uVar10;
    if (0 < (long)uVar10) {
      uVar29 = uVar10;
    }
    uVar29 = uVar29 * uVar27 + 0x20 >> 6;
    uVar27 = -uVar29;
    if (-1 < (long)(uVar26 ^ uVar10)) {
      uVar27 = uVar29;
    }
    slot->linearVertAdvance = uVar27;
  }
  if ((uVar21 >> 0xb & 1) != 0) goto LAB_0021096f;
  pFVar11 = face->internal;
  uVar22 = pFVar11->transform_flags;
  if (uVar22 == 0) goto LAB_0021096f;
  pFVar12 = (slot->face->driver->root).library;
  pFVar30 = pFVar12->cur_renderer;
  if (pFVar30 == (FT_Renderer_conflict)0x0) {
    FVar23 = slot->format;
LAB_002108f2:
    for (pFVar28 = (pFVar12->renderers).head; pFVar28 != (FT_ListNode)0x0; pFVar28 = pFVar28->next)
    {
      pFVar30 = (FT_Renderer_conflict)pFVar28->data;
      if (pFVar30->glyph_format == FVar23) goto LAB_002108d0;
    }
    if (FVar23 == FT_GLYPH_FORMAT_OUTLINE) {
      if ((uVar22 & 1) != 0) {
        FT_Outline_Transform(&slot->outline,&pFVar11->transform_matrix);
        uVar22 = pFVar11->transform_flags;
      }
      if (((uVar22 & 2) != 0) && (sVar1 = (slot->outline).n_points, iVar16 = (int)sVar1, 0 < sVar1))
      {
        lVar13 = (pFVar11->transform_delta).x;
        lVar14 = (pFVar11->transform_delta).y;
        pFVar25 = (slot->outline).points;
        do {
          pFVar25->x = pFVar25->x + lVar13;
          pFVar25->y = pFVar25->y + lVar14;
          pFVar25 = pFVar25 + 1;
          iVar16 = iVar16 + -1;
        } while (iVar16 != 0);
      }
    }
  }
  else {
    FVar23 = slot->format;
    if (pFVar30->glyph_format != FVar23) goto LAB_002108f2;
LAB_002108d0:
    FVar15 = (*pFVar30->clazz->transform_glyph)
                       (pFVar30,slot,&pFVar11->transform_matrix,&pFVar11->transform_delta);
  }
  FT_Vector_Transform(&slot->advance,&pFVar11->transform_matrix);
LAB_0021096f:
  slot->glyph_index = glyph_index;
  slot->internal->load_flags = uVar21;
  if ((((FVar15 == 0) && (FVar15 = 0, (uVar21 & 1) == 0)) &&
      (slot->format != FT_GLYPH_FORMAT_BITMAP)) && (slot->format != FT_GLYPH_FORMAT_COMPOSITE)) {
    FVar17 = uVar21 >> 0x10 & 0xf;
    render_mode = uVar21 >> 0xb & FT_RENDER_MODE_MONO;
    if (FVar17 != FT_RENDER_MODE_NORMAL) {
      render_mode = FVar17;
    }
    if ((uVar21 & 4) == 0) {
      FVar15 = 0;
      ft_glyphslot_preset_bitmap(slot,render_mode,(FT_Vector *)0x0);
    }
    else {
      if (slot->face != (FT_Face)0x0) {
        FVar15 = FT_Render_Glyph_Internal((slot->face->driver->root).library,slot,render_mode);
        return FVar15;
      }
      FVar15 = 6;
    }
  }
  return FVar15;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Glyph( FT_Face   face,
                 FT_UInt   glyph_index,
                 FT_Int32  load_flags )
  {
    FT_Error      error;
    FT_Driver     driver;
    FT_GlyphSlot  slot;
    FT_Library    library;
    FT_Bool       autohint = FALSE;
    FT_Module     hinter;
    TT_Face       ttface = (TT_Face)face;


    if ( !face || !face->size || !face->glyph )
      return FT_THROW( Invalid_Face_Handle );

    /* The validity test for `glyph_index' is performed by the */
    /* font drivers.                                           */

    slot = face->glyph;
    ft_glyphslot_clear( slot );

    driver  = face->driver;
    library = driver->root.library;
    hinter  = library->auto_hinter;

    /* undefined scale means no scale */
    if ( face->size->metrics.x_ppem == 0 ||
         face->size->metrics.y_ppem == 0 )
      load_flags |= FT_LOAD_NO_SCALE;

    /* resolve load flags dependencies */

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE         |
                    FT_LOAD_IGNORE_TRANSFORM;

    if ( load_flags & FT_LOAD_NO_SCALE )
    {
      load_flags |= FT_LOAD_NO_HINTING |
                    FT_LOAD_NO_BITMAP;

      load_flags &= ~FT_LOAD_RENDER;
    }

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      load_flags &= ~FT_LOAD_RENDER;

    /*
     * Determine whether we need to auto-hint or not.
     * The general rules are:
     *
     * - Do only auto-hinting if we have
     *
     *   - a hinter module,
     *   - a scalable font,
     *   - not a tricky font, and
     *   - no transforms except simple slants and/or rotations by
     *     integer multiples of 90 degrees.
     *
     * - Then, auto-hint if FT_LOAD_FORCE_AUTOHINT is set or if we don't
     *   have a native font hinter.
     *
     * - Otherwise, auto-hint for LIGHT hinting mode or if there isn't
     *   any hinting bytecode in the TrueType/OpenType font.
     *
     * - Exception: The font is `tricky' and requires the native hinter to
     *   load properly.
     */

    if ( hinter                                           &&
         !( load_flags & FT_LOAD_NO_HINTING )             &&
         !( load_flags & FT_LOAD_NO_AUTOHINT )            &&
         FT_IS_SCALABLE( face )                           &&
         !FT_IS_TRICKY( face )                            &&
         ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM )    ||
           ( face->internal->transform_matrix.yx == 0 &&
             face->internal->transform_matrix.xx != 0 ) ||
           ( face->internal->transform_matrix.xx == 0 &&
             face->internal->transform_matrix.yx != 0 ) ) )
    {
      if ( ( load_flags & FT_LOAD_FORCE_AUTOHINT ) ||
           !FT_DRIVER_HAS_HINTER( driver )         )
        autohint = TRUE;
      else
      {
        FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );
        FT_Bool         is_light_type1;


        /* only the new Adobe engine (for both CFF and Type 1) is `light'; */
        /* we use `strstr' to catch both `Type 1' and `CID Type 1'         */
        is_light_type1 =
          ft_strstr( FT_Get_Font_Format( face ), "Type 1" ) != NULL &&
          ((PS_Driver)driver)->hinting_engine == FT_HINTING_ADOBE;

        /* the check for `num_locations' assures that we actually    */
        /* test for instructions in a TTF and not in a CFF-based OTF */
        /*                                                           */
        /* since `maxSizeOfInstructions' might be unreliable, we     */
        /* check the size of the `fpgm' and `prep' tables, too --    */
        /* the assumption is that there don't exist real TTFs where  */
        /* both `fpgm' and `prep' tables are missing                 */
        if ( ( mode == FT_RENDER_MODE_LIGHT           &&
               ( !FT_DRIVER_HINTS_LIGHTLY( driver ) &&
                 !is_light_type1                    ) )         ||
             ( FT_IS_SFNT( face )                             &&
               ttface->num_locations                          &&
               ttface->max_profile.maxSizeOfInstructions == 0 &&
               ttface->font_program_size == 0                 &&
               ttface->cvt_program_size == 0                  ) )
          autohint = TRUE;
      }
    }

    if ( autohint )
    {
      FT_AutoHinter_Interface  hinting;


      /* XXX: The use of the `FT_LOAD_XXX_ONLY` flags is not very */
      /*      elegant.                                            */

      /* try to load SVG documents if available */
      if ( FT_HAS_SVG( face ) )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SVG_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_SVG )
          goto Load_Ok;
      }

      /* try to load embedded bitmaps if available */
      if ( FT_HAS_FIXED_SIZES( face )              &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SBITS_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_BITMAP )
          goto Load_Ok;
      }

      {
        FT_Face_Internal  internal        = face->internal;
        FT_Int            transform_flags = internal->transform_flags;


        /* since the auto-hinter calls FT_Load_Glyph by itself, */
        /* make sure that glyphs aren't transformed             */
        internal->transform_flags = 0;

        /* load auto-hinted outline */
        hinting = (FT_AutoHinter_Interface)hinter->clazz->module_interface;

        error   = hinting->load_glyph( (FT_AutoHinter)hinter,
                                       slot, face->size,
                                       glyph_index, load_flags );

        internal->transform_flags = transform_flags;
      }
    }
    else
    {
      error = driver->clazz->load_glyph( slot,
                                         face->size,
                                         glyph_index,
                                         load_flags );
      if ( error )
        goto Exit;

      if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
      {
        /* check that the loaded outline is correct */
        error = FT_Outline_Check( &slot->outline );
        if ( error )
          goto Exit;

#ifdef GRID_FIT_METRICS
        if ( !( load_flags & FT_LOAD_NO_HINTING ) )
          ft_glyphslot_grid_fit_metrics(
            slot,
            FT_BOOL( load_flags & FT_LOAD_VERTICAL_LAYOUT ) );
#endif
      }
    }

  Load_Ok:
    /* compute the advance */
    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      slot->advance.x = 0;
      slot->advance.y = slot->metrics.vertAdvance;
    }
    else
    {
      slot->advance.x = slot->metrics.horiAdvance;
      slot->advance.y = 0;
    }

    /* compute the linear advance in 16.16 pixels */
    if ( ( load_flags & FT_LOAD_LINEAR_DESIGN ) == 0 &&
         FT_IS_SCALABLE( face )                      )
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      /* it's tricky! */
      slot->linearHoriAdvance = FT_MulDiv( slot->linearHoriAdvance,
                                           metrics->x_scale, 64 );

      slot->linearVertAdvance = FT_MulDiv( slot->linearVertAdvance,
                                           metrics->y_scale, 64 );
    }

    if ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM ) == 0 )
    {
      FT_Face_Internal  internal = face->internal;


      /* now, transform the glyph image if needed */
      if ( internal->transform_flags )
      {
        /* get renderer */
        FT_Renderer  renderer = ft_lookup_glyph_renderer( slot );


        if ( renderer )
          error = renderer->clazz->transform_glyph(
                                     renderer, slot,
                                     &internal->transform_matrix,
                                     &internal->transform_delta );
        else if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          /* apply `standard' transformation if no renderer is available */
          if ( internal->transform_flags & 1 )
            FT_Outline_Transform( &slot->outline,
                                  &internal->transform_matrix );

          if ( internal->transform_flags & 2 )
            FT_Outline_Translate( &slot->outline,
                                  internal->transform_delta.x,
                                  internal->transform_delta.y );
        }

        /* transform advance */
        FT_Vector_Transform( &slot->advance, &internal->transform_matrix );
      }
    }

    slot->glyph_index          = glyph_index;
    slot->internal->load_flags = load_flags;

    /* do we need to render the image or preset the bitmap now? */
    if ( !error                                    &&
         ( load_flags & FT_LOAD_NO_SCALE ) == 0    &&
         slot->format != FT_GLYPH_FORMAT_BITMAP    &&
         slot->format != FT_GLYPH_FORMAT_COMPOSITE )
    {
      FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );


      if ( mode == FT_RENDER_MODE_NORMAL   &&
           load_flags & FT_LOAD_MONOCHROME )
        mode = FT_RENDER_MODE_MONO;

      if ( load_flags & FT_LOAD_RENDER )
        error = FT_Render_Glyph( slot, mode );
      else
        ft_glyphslot_preset_bitmap( slot, mode, NULL );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Load_Glyph: index %d, flags 0x%x\n",
                glyph_index, load_flags ));
    FT_TRACE5(( "  bitmap %dx%d %s, %s (mode %d)\n",
                slot->bitmap.width,
                slot->bitmap.rows,
                slot->outline.points ?
                  slot->bitmap.buffer ? "rendered"
                                      : "preset"
                                     :
                  slot->internal->flags & FT_GLYPH_OWN_BITMAP ? "owned"
                                                              : "unowned",
                pixel_modes[slot->bitmap.pixel_mode],
                slot->bitmap.pixel_mode ));
    FT_TRACE5(( "\n" ));
    FT_TRACE5(( "  x advance: %f\n", (double)slot->advance.x / 64 ));
    FT_TRACE5(( "  y advance: %f\n", (double)slot->advance.y / 64 ));
    FT_TRACE5(( "  linear x advance: %f\n",
                (double)slot->linearHoriAdvance / 65536 ));
    FT_TRACE5(( "  linear y advance: %f\n",
                (double)slot->linearVertAdvance / 65536 ));

    {
      FT_Glyph_Metrics*  metrics = &slot->metrics;


      FT_TRACE5(( "  metrics:\n" ));
      FT_TRACE5(( "    width:  %f\n", (double)metrics->width / 64 ));
      FT_TRACE5(( "    height: %f\n", (double)metrics->height / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    horiBearingX: %f\n",
                  (double)metrics->horiBearingX / 64 ));
      FT_TRACE5(( "    horiBearingY: %f\n",
                  (double)metrics->horiBearingY / 64 ));
      FT_TRACE5(( "    horiAdvance:  %f\n",
                  (double)metrics->horiAdvance / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    vertBearingX: %f\n",
                  (double)metrics->vertBearingX / 64 ));
      FT_TRACE5(( "    vertBearingY: %f\n",
                  (double)metrics->vertBearingY / 64 ));
      FT_TRACE5(( "    vertAdvance:  %f\n",
                  (double)metrics->vertAdvance / 64 ));
    }
#endif

  Exit:
    return error;
  }